

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * ot::commissioner::coap::Message::SplitUriPath
                  (Error *__return_storage_ptr__,
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *aUriPathList,string *aUriPath)

{
  ulong uVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::find((char)aUriPath,0x2f);
    if (uVar1 == 0xffffffffffffffff) break;
    if (uVar2 < uVar1) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)aUriPath);
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)aUriPathList,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    uVar2 = uVar1 + 1;
  }
  if (uVar2 < aUriPath->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)aUriPath);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)aUriPathList,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((aUriPathList->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)aUriPathList) {
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[2]>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)aUriPathList,
               (char (*) [2])0x1fdfd0);
  }
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Error Message::SplitUriPath(std::list<std::string> &aUriPathList, const std::string &aUriPath)
{
    const auto &uri = aUriPath;

    size_t begin = 0;
    while (true)
    {
        auto pos = uri.find_first_of('/', begin);
        if (pos == std::string::npos)
        {
            break;
        }
        if (pos > begin)
        {
            aUriPathList.emplace_back(uri.substr(begin, pos - begin));
        }
        begin = pos + 1;
    }

    if (begin < uri.size())
    {
        aUriPathList.emplace_back(uri.substr(begin));
    }

    if (aUriPathList.empty())
    {
        // For example, uri path is "/", "//"
        aUriPathList.emplace_back("/");
    }

    return ERROR_NONE;
}